

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  ImGuiDebugLogFlags *flags;
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  int *piVar4;
  _func_void_void_ptr_char_ptr *p_Var5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiID id;
  char *pcVar8;
  ImGuiContext *g_1;
  int iVar9;
  char *pcVar10;
  ImGuiContext *g;
  long lVar11;
  long lVar12;
  ImGuiListClipper clipper;
  ImGuiListClipper local_68;
  
  pIVar6 = GImGui;
  uVar2 = (GImGui->NextWindowData).Flags;
  if ((uVar2 & 2) == 0) {
    fVar1 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar2 | 2;
    (pIVar6->NextWindowData).SizeVal.x = 0.0;
    (pIVar6->NextWindowData).SizeVal.y = fVar1 * 12.0;
    (pIVar6->NextWindowData).SizeCond = 4;
  }
  bVar7 = Begin("Dear ImGui Debug Log",p_open,0);
  if ((bVar7) &&
     (pIVar3 = GImGui->CurrentWindow, pIVar3->WriteAccessed = true, pIVar3->BeginCount < 2)) {
    flags = &pIVar6->DebugLogFlags;
    CheckboxFlags("All",flags,0x7f);
    SetItemTooltip("(except InputRouting which is spammy)");
    ShowDebugLogFlag("ActiveId",1);
    ShowDebugLogFlag("Clipper",0x10);
    ShowDebugLogFlag("Focus",2);
    ShowDebugLogFlag("IO",0x40);
    ShowDebugLogFlag("Nav",8);
    ShowDebugLogFlag("Popup",4);
    ShowDebugLogFlag("Selection",0x20);
    ShowDebugLogFlag("InputRouting",0x80);
    bVar7 = SmallButton("Clear");
    if (bVar7) {
      pcVar8 = (pIVar6->DebugLogBuf).Buf.Data;
      if (pcVar8 != (char *)0x0) {
        (pIVar6->DebugLogBuf).Buf.Size = 0;
        (pIVar6->DebugLogBuf).Buf.Capacity = 0;
        MemFree(pcVar8);
        (pIVar6->DebugLogBuf).Buf.Data = (char *)0x0;
      }
      piVar4 = (pIVar6->DebugLogIndex).LineOffsets.Data;
      if (piVar4 != (int *)0x0) {
        (pIVar6->DebugLogIndex).LineOffsets.Size = 0;
        (pIVar6->DebugLogIndex).LineOffsets.Capacity = 0;
        MemFree(piVar4);
        (pIVar6->DebugLogIndex).LineOffsets.Data = (int *)0x0;
      }
      (pIVar6->DebugLogIndex).EndOffset = 0;
    }
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    bVar7 = SmallButton("Copy");
    if ((bVar7) &&
       (p_Var5 = (GImGui->IO).SetClipboardTextFn, p_Var5 != (_func_void_void_ptr_char_ptr *)0x0)) {
      pcVar8 = (pIVar6->DebugLogBuf).Buf.Data;
      pcVar10 = ImGuiTextBuffer::EmptyString;
      if (pcVar8 != (char *)0x0) {
        pcVar10 = pcVar8;
      }
      (*p_Var5)((GImGui->IO).ClipboardUserData,pcVar10);
    }
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    bVar7 = SmallButton("Configure Outputs..");
    if (bVar7) {
      OpenPopup("Outputs",0);
    }
    bVar7 = BeginPopup("Outputs",0);
    if (bVar7) {
      CheckboxFlags("OutputToTTY",flags,0x100000);
      BeginDisabled(true);
      CheckboxFlags("OutputToTestEngine",flags,0x200000);
      EndDisabled();
      EndPopup();
    }
    local_68.Ctx = (ImGuiContext *)0x0;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    id = ImGuiWindow::GetID(pIVar3,"##log",(char *)0x0);
    BeginChildEx("##log",id,(ImVec2 *)&local_68,1,0xc000);
    uVar2 = pIVar6->DebugLogFlags;
    pIVar6->DebugLogFlags = uVar2 & 0xffffffef;
    local_68.StartSeekOffsetY = 0.0;
    local_68.TempData = (void *)0x0;
    local_68.ItemsCount = 0;
    local_68.ItemsHeight = 0.0;
    local_68.StartPosY = 0.0;
    local_68._28_4_ = 0;
    local_68.Ctx = (ImGuiContext *)0x0;
    local_68.DisplayStart = 0;
    local_68.DisplayEnd = 0;
    ImGuiListClipper::Begin(&local_68,(pIVar6->DebugLogIndex).LineOffsets.Size,-1.0);
    while( true ) {
      bVar7 = ImGuiListClipper::Step(&local_68);
      if (!bVar7) break;
      lVar12 = (long)local_68.DisplayStart;
      while (lVar11 = lVar12 + 1, lVar12 < local_68.DisplayEnd) {
        pcVar8 = (pIVar6->DebugLogBuf).Buf.Data;
        piVar4 = (pIVar6->DebugLogIndex).LineOffsets.Data;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = ImGuiTextBuffer::EmptyString;
        }
        if (lVar11 < (pIVar6->DebugLogIndex).LineOffsets.Size) {
          iVar9 = piVar4[lVar11] + -1;
        }
        else {
          iVar9 = (pIVar6->DebugLogIndex).EndOffset;
        }
        DebugTextUnformattedWithLocateItem(pcVar8 + piVar4[lVar12],pcVar8 + iVar9);
        lVar12 = lVar11;
      }
    }
    *flags = uVar2;
    if ((GImGui->CurrentWindow->ScrollMax).y <= (GImGui->CurrentWindow->Scroll).y) {
      SetScrollHereY(1.0);
    }
    EndChild();
    End();
    ImGuiListClipper::End(&local_68);
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    ImGuiDebugLogFlags all_enable_flags = ImGuiDebugLogFlags_EventMask_ & ~ImGuiDebugLogFlags_EventInputRouting;
    CheckboxFlags("All", &g.DebugLogFlags, all_enable_flags);
    SetItemTooltip("(except InputRouting which is spammy)");

    ShowDebugLogFlag("ActiveId", ImGuiDebugLogFlags_EventActiveId);
    ShowDebugLogFlag("Clipper", ImGuiDebugLogFlags_EventClipper);
    ShowDebugLogFlag("Focus", ImGuiDebugLogFlags_EventFocus);
    ShowDebugLogFlag("IO", ImGuiDebugLogFlags_EventIO);
    ShowDebugLogFlag("Nav", ImGuiDebugLogFlags_EventNav);
    ShowDebugLogFlag("Popup", ImGuiDebugLogFlags_EventPopup);
    ShowDebugLogFlag("Selection", ImGuiDebugLogFlags_EventSelection);
    ShowDebugLogFlag("InputRouting", ImGuiDebugLogFlags_EventInputRouting);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    SameLine();
    if (SmallButton("Configure Outputs.."))
        OpenPopup("Outputs");
    if (BeginPopup("Outputs"))
    {
        CheckboxFlags("OutputToTTY", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTTY);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        BeginDisabled();
#endif
        CheckboxFlags("OutputToTestEngine", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTestEngine);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        EndDisabled();
#endif
        EndPopup();
    }

    BeginChild("##log", ImVec2(0.0f, 0.0f), ImGuiChildFlags_Border, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    const ImGuiDebugLogFlags backup_log_flags = g.DebugLogFlags;
    g.DebugLogFlags &= ~ImGuiDebugLogFlags_EventClipper;

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
            DebugTextUnformattedWithLocateItem(g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no), g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no));
    g.DebugLogFlags = backup_log_flags;
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}